

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Colour::SetMasteringMetadata(Colour *this,MasteringMetadata *mastering_metadata)

{
  MasteringMetadata *this_00;
  pointer pMVar1;
  pointer pMVar2;
  PrimaryChromaticity PVar3;
  int in_ECX;
  void *extraout_RDX;
  MasteringMetadata *in_RSI;
  PrimaryChromaticity *in_RDI;
  char *in_R8;
  int in_R9D;
  float luminance_max;
  float luminance_min;
  unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_> mm_ptr;
  int iVar4;
  pointer in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  MasteringMetadata *this_01;
  bool local_1;
  
  this_00 = (MasteringMetadata *)operator_new(0x28);
  MasteringMetadata::MasteringMetadata(this_00);
  this_01 = this_00;
  std::unique_ptr<mkvmuxer::MasteringMetadata,std::default_delete<mkvmuxer::MasteringMetadata>>::
  unique_ptr<std::default_delete<mkvmuxer::MasteringMetadata>,void>
            ((unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
              *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
  iVar4 = (int)in_stack_ffffffffffffff68;
  pMVar1 = std::
           unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
           ::get((unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                  *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  if (pMVar1 == (pointer)0x0) {
    local_1 = false;
  }
  else {
    pMVar1 = std::
             unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
             ::operator->((unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                           *)0x16110b);
    luminance_max = MasteringMetadata::luminance_max(in_RSI);
    MasteringMetadata::set_luminance_max(pMVar1,luminance_max);
    pMVar2 = std::
             unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
             ::operator->((unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                           *)0x161141);
    luminance_min = MasteringMetadata::luminance_min(in_RSI);
    MasteringMetadata::set_luminance_min(pMVar2,luminance_min);
    pMVar2 = std::
             unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
             ::operator->((unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                           *)0x161177);
    MasteringMetadata::r(in_RSI,this_00,extraout_RDX,in_ECX,in_R8,in_R9D,iVar4);
    MasteringMetadata::g(in_RSI);
    MasteringMetadata::b(in_RSI);
    MasteringMetadata::white_point(in_RSI);
    in_stack_ffffffffffffff77 =
         MasteringMetadata::SetChromaticity
                   (this_01,in_RDI,
                    (PrimaryChromaticity *)CONCAT44(luminance_max,in_stack_ffffffffffffffb8),
                    (PrimaryChromaticity *)pMVar1,
                    (PrimaryChromaticity *)CONCAT44(luminance_min,in_stack_ffffffffffffffa8));
    if ((bool)in_stack_ffffffffffffff77) {
      PVar3 = in_RDI[0xd];
      if (PVar3 != (PrimaryChromaticity)0x0) {
        MasteringMetadata::~MasteringMetadata(pMVar2);
        operator_delete((void *)PVar3);
      }
      PVar3 = (PrimaryChromaticity)
              std::
              unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
              ::release((unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                         *)0x161255);
      in_RDI[0xd] = PVar3;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  std::unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>::
  ~unique_ptr((unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
               *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  return local_1;
}

Assistant:

bool Colour::SetMasteringMetadata(const MasteringMetadata& mastering_metadata) {
  std::unique_ptr<MasteringMetadata> mm_ptr(new MasteringMetadata());
  if (!mm_ptr.get())
    return false;

  mm_ptr->set_luminance_max(mastering_metadata.luminance_max());
  mm_ptr->set_luminance_min(mastering_metadata.luminance_min());

  if (!mm_ptr->SetChromaticity(mastering_metadata.r(), mastering_metadata.g(),
                               mastering_metadata.b(),
                               mastering_metadata.white_point())) {
    return false;
  }

  delete mastering_metadata_;
  mastering_metadata_ = mm_ptr.release();
  return true;
}